

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  int32_t iVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  undefined1 *in_RDX;
  char in_SIL;
  array_container_t *in_RDI;
  int local_run_end;
  int run_end;
  uint64_t cur_word_with_1s;
  int run_start_1;
  int local_run_start;
  uint64_t cur_word;
  int long_ctr;
  run_container_t *answer_1;
  int32_t size_as_bitset_container;
  int32_t size_as_run_container_1;
  int32_t n_runs_1;
  bitset_container_t *c_qua_bitset;
  uint16_t cur_val;
  int i;
  int run_start;
  int prev;
  run_container_t *answer;
  int32_t size_as_array_container;
  int32_t card;
  int32_t size_as_run_container;
  int32_t n_runs;
  array_container_t *c_qua_array;
  container_t *newc;
  int32_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ulong local_98;
  unsigned_long_long local_88;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint8_t *in_stack_ffffffffffffffa0;
  array_container_t *paVar5;
  undefined2 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffaa;
  ushort uVar6;
  undefined4 in_stack_ffffffffffffffac;
  int iVar7;
  uint local_50;
  uint local_4c;
  array_container_t *local_8;
  
  if (in_SIL == '\x03') {
    local_8 = (array_container_t *)
              convert_run_to_efficient_container
                        ((run_container_t *)
                         CONCAT44(in_stack_ffffffffffffffac,
                                  CONCAT22(in_stack_ffffffffffffffaa,in_stack_ffffffffffffffa8)),
                         in_stack_ffffffffffffffa0);
    if (local_8 != in_RDI) {
      container_free((container_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (uint8_t)((uint)in_stack_ffffffffffffff5c >> 0x18));
    }
  }
  else if (in_SIL == '\x02') {
    iVar1 = array_container_number_of_runs(in_RDI);
    iVar1 = run_container_serialized_size_in_bytes(iVar1);
    iVar2 = array_container_cardinality(in_RDI);
    iVar3 = array_container_serialized_size_in_bytes(iVar2);
    if (iVar1 < iVar3) {
      local_8 = (array_container_t *)run_container_create_given_capacity(in_stack_ffffffffffffff5c);
      local_4c = 0xfffffffe;
      local_50 = 0xffffffff;
      for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
        uVar6 = in_RDI->array[iVar7];
        if ((uint)uVar6 != local_4c + 1) {
          if (local_50 != 0xffffffff) {
            add_run((run_container_t *)local_8,local_50,local_4c);
          }
          local_50 = (uint)uVar6;
        }
        local_4c = (uint)in_RDI->array[iVar7];
      }
      add_run((run_container_t *)local_8,local_50,local_4c);
      *in_RDX = 3;
      array_container_free((array_container_t *)0x15ef28);
    }
    else {
      *in_RDX = 2;
      local_8 = in_RDI;
    }
  }
  else if (in_SIL == '\x01') {
    paVar5 = in_RDI;
    iVar2 = bitset_container_number_of_runs
                      ((bitset_container_t *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    iVar1 = run_container_serialized_size_in_bytes(iVar2);
    iVar3 = bitset_container_serialized_size_in_bytes();
    if (iVar1 < iVar3) {
      local_8 = (array_container_t *)run_container_create_given_capacity(in_stack_ffffffffffffff5c);
      iVar2 = 0;
      local_88 = *(unsigned_long_long *)paVar5->array;
      while( true ) {
        while (local_88 == 0 && iVar2 < 0x3ff) {
          iVar2 = iVar2 + 1;
          local_88 = *(unsigned_long_long *)(paVar5->array + (long)iVar2 * 4);
        }
        if (local_88 == 0) {
          bitset_container_free((bitset_container_t *)0x15f02a);
          *in_RDX = 3;
          return local_8;
        }
        iVar7 = roaring_trailing_zeroes(local_88);
        iVar7 = iVar7 + iVar2 * 0x40;
        local_98 = local_88 | local_88 - 1;
        while (local_98 == 0xffffffffffffffff && iVar2 < 0x3ff) {
          iVar2 = iVar2 + 1;
          local_98 = *(ulong *)(paVar5->array + (long)iVar2 * 4);
        }
        if (local_98 == 0xffffffffffffffff) break;
        iVar4 = roaring_trailing_zeroes(local_98 ^ 0xffffffffffffffff);
        add_run((run_container_t *)local_8,iVar7,iVar4 + iVar2 * 0x40 + -1);
        local_88 = local_98 & local_98 + 1;
      }
      add_run((run_container_t *)local_8,iVar7,iVar2 * 0x40 + 0x3f);
      bitset_container_free((bitset_container_t *)0x15f102);
      *in_RDX = 3;
    }
    else {
      *in_RDX = 1;
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

container_t *convert_run_optimize(container_t *c, uint8_t typecode_original,
                                  uint8_t *typecode_after) {
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc =
            convert_run_to_efficient_container(CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = roaring_trailing_zeroes(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = roaring_trailing_zeroes(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        roaring_unreachable;
        return NULL;
    }
}